

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *this_00;
  pointer *pppAVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pbVar4;
  pointer pcVar5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  Option *pOVar6;
  pointer psVar7;
  pointer puVar8;
  element_type *peVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  iterator __position;
  App *pAVar11;
  bool bVar12;
  type_conflict1 tVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  Classifier CVar17;
  Option_p *opt;
  HorribleError *pHVar18;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var19;
  void *pvVar20;
  pointer puVar21;
  App *pAVar22;
  pointer psVar23;
  ulong extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  ArgumentMismatch *pAVar25;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar26;
  Classifier CVar27;
  uint uVar28;
  undefined8 uVar29;
  long lVar30;
  ulong uVar31;
  size_type __n;
  string v;
  App *sub;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  string arg_name;
  string rest;
  string value;
  string current;
  undefined1 local_3f0 [32];
  App *local_3d0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_3c8;
  int local_3bc;
  App *local_3b8;
  Classifier local_3ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  undefined1 *local_2e8;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  _Any_data local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  string local_1d8;
  string local_1b8;
  string local_198;
  anon_class_40_2_a297e68f_for__M_pred local_178;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_308._M_allocated_capacity = (size_type)&local_2f8;
  pcVar5 = pbVar4[-1]._M_dataplus._M_p;
  local_3d0 = this;
  local_3c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
  local_388._M_allocated_capacity = (size_type)&local_378;
  local_388._8_8_ = 0;
  local_378._M_local_buf[0] = '\0';
  local_328._M_allocated_capacity = (size_type)&local_318;
  local_328._8_8_ = 0;
  local_318._M_local_buf[0] = '\0';
  local_348._M_allocated_capacity = (size_type)&local_338;
  local_348._8_8_ = 0;
  local_338._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar12 = CLI::detail::split_short
                       ((string *)&local_308,(string *)&local_388,(string *)&local_348);
    if (!bVar12) {
      pHVar18 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar18,&local_f0);
      __cxa_throw(pHVar18,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar12 = CLI::detail::split_windows_style
                       ((string *)&local_308,(string *)&local_388,(string *)&local_328);
    if (!bVar12) {
      pHVar18 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"windows option parsed but missing! You should not see this",
                 "");
      HorribleError::HorribleError(pHVar18,&local_110);
      __cxa_throw(pHVar18,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar18 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar18,&local_130);
      __cxa_throw(pHVar18,&HorribleError::typeinfo,Error::~Error);
    }
    bVar12 = CLI::detail::split_long((string *)&local_308,(string *)&local_388,(string *)&local_328)
    ;
    if (!bVar12) {
      pHVar18 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       *(pointer *)(local_3c8 + 8) + -1);
      HorribleError::HorribleError(pHVar18,&local_50);
      __cxa_throw(pHVar18,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var19._M_current =
       (local_3d0->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (local_3d0->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar3 = &local_178.arg_name.field_2;
  local_178.arg_name._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_388._M_allocated_capacity,
             local_388._8_8_ + local_388._M_allocated_capacity);
  local_178.current_type = current_type;
  _Var19 = ::std::
           find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                     (_Var19,__last,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.arg_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_178.arg_name._M_dataplus._M_p,
                    local_178.arg_name.field_2._M_allocated_capacity + 1);
  }
  if (_Var19._M_current !=
      (local_3d0->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar4 = *(pointer *)(local_3c8 + 8);
    *(pointer *)(local_3c8 + 8) = pbVar4 + -1;
    pcVar5 = pbVar4[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != &pbVar4[-1].field_2) {
      operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
    }
    pAVar22 = local_3d0;
    pOVar6 = ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((pOVar6->inject_separator_ == true) &&
        (pbVar4 = *(pointer *)
                   ((long)&(pOVar6->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   + 8),
        (pOVar6->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar4)) && (pbVar4[-1]._M_string_length != 0))
    {
      local_198._M_string_length = 0;
      local_198.field_2._M_local_buf[0] = '\0';
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      Option::_add_result(pOVar6,&local_198,&pOVar6->results_);
      pOVar6->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,
                        CONCAT71(local_198.field_2._M_allocated_capacity._1_7_,
                                 local_198.field_2._M_local_buf[0]) + 1);
      }
    }
    pOVar6 = ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((pOVar6->trigger_on_result_ == true) && (pOVar6->current_option_state_ == callback_run)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&pOVar6->results_,
                        *(pointer *)
                         &(pOVar6->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl);
      pOVar6->current_option_state_ = parsing;
    }
    pOVar6 = ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar15 = pOVar6->type_size_min_;
    local_3bc = pOVar6->expected_min_ * iVar15;
    if (iVar15 <= local_3bc) {
      local_3bc = iVar15;
    }
    local_3f0._0_4_ = pOVar6->type_size_max_;
    tVar13 = CLI::detail::checked_multiply<int>((int *)local_3f0,pOVar6->expected_max_);
    CVar27 = 0x20000000;
    if (tVar13) {
      CVar27 = local_3f0._0_4_;
    }
    if ((0x1ffffff < (int)CVar27) &&
       (pOVar6 = ((_Var19._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       pOVar6->allow_extra_args_ == false)) {
      local_3f0._0_4_ = pOVar6->type_size_max_;
      tVar13 = CLI::detail::checked_multiply<int>((int *)local_3f0,pOVar6->expected_min_);
      CVar27 = 0x20000000;
      if (tVar13) {
        CVar27 = local_3f0._0_4_;
      }
    }
    if (CVar27 == NONE) {
      pOVar6 = ((_Var19._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_328._M_allocated_capacity,
                 local_328._8_8_ + local_328._M_allocated_capacity);
      Option::get_flag_value((string *)local_3f0,pOVar6,(string *)&local_388,&local_1d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      pOVar6 = ((_Var19._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1f8._M_allocated_capacity = (size_type)&local_1e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_3f0._0_8_,(pointer)(local_3f0._0_8_ + local_3f0._8_8_));
      Option::_add_result(pOVar6,(string *)&local_1f8,&pOVar6->results_);
      pOVar6->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_allocated_capacity != &local_1e8) {
        operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1)
        ;
      }
      local_2b8._M_unused._M_object =
           ((_Var19._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar22->parse_order_,
                 (Option **)&local_2b8);
      if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
        operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
      }
LAB_001b7be4:
      iVar15 = 0;
    }
    else if (local_328._8_8_ == 0) {
      if (local_348._8_8_ == 0) goto LAB_001b7be4;
      pOVar6 = ((_Var19._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_348._M_allocated_capacity,
                 local_348._8_8_ + local_348._M_allocated_capacity);
      iVar15 = Option::_add_result(pOVar6,&local_238,&pOVar6->results_);
      pAVar22 = local_3d0;
      pOVar6->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_3f0._0_8_ =
           ((_Var19._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar22->parse_order_,
                 (Option **)local_3f0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_348,0,
                 local_348._8_8_,"",0);
    }
    else {
      pOVar6 = ((_Var19._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_328._M_allocated_capacity,
                 local_328._8_8_ + local_328._M_allocated_capacity);
      iVar15 = Option::_add_result(pOVar6,&local_218,&pOVar6->results_);
      pAVar22 = local_3d0;
      pOVar6->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_3f0._0_8_ =
           ((_Var19._M_current)->_M_t).
           super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
           super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar22->parse_order_,
                 (Option **)local_3f0);
    }
    local_3ac = CVar27;
    if (iVar15 < local_3bc) {
      this_00 = &local_3d0->parse_order_;
      do {
        pbVar4 = *(pointer *)(local_3c8 + 8);
        if (*(pointer *)local_3c8 == pbVar4) {
          pAVar25 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_70,
                     ((_Var19._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          Option::get_type_name_abi_cxx11_
                    (&local_90,
                     ((_Var19._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::TypedAtLeast(pAVar25,&local_70,local_3bc,&local_90);
          __cxa_throw(pAVar25,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_3f0._0_8_ = local_3f0 + 0x10;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f0,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
        pbVar4 = *(pointer *)(local_3c8 + 8);
        *(pointer *)(local_3c8 + 8) = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
        }
        pOVar6 = ((_Var19._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_258._M_allocated_capacity = (size_type)&local_248;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_3f0._0_8_,(pointer)(local_3f0._0_8_ + local_3f0._8_8_)
                  );
        iVar16 = Option::_add_result(pOVar6,(string *)&local_258,&pOVar6->results_);
        pOVar6->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_allocated_capacity != &local_248) {
          operator_delete((void *)local_258._M_allocated_capacity,
                          local_248._M_allocated_capacity + 1);
        }
        local_2b8._M_unused._M_object =
             ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)this_00,
                   (Option **)&local_2b8);
        if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        iVar15 = iVar15 + iVar16;
      } while (iVar15 < local_3bc);
    }
    if ((iVar15 < (int)local_3ac) ||
       ((((_Var19._M_current)->_M_t).
         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
      puVar21 = (local_3d0->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = (local_3d0->options_).
               super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar21 == puVar8) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0;
        do {
          pOVar6 = (puVar21->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          if (((((pOVar6->pname_)._M_string_length != 0) &&
               ((pOVar6->super_OptionBase<CLI::Option>).required_ == true)) &&
              (uVar28 = pOVar6->expected_min_ * pOVar6->type_size_min_, 0 < (int)uVar28)) &&
             (lVar30 = (long)*(pointer *)
                              ((long)&(pOVar6->results_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              + 8) -
                       *(long *)&(pOVar6->results_).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl >> 5, (int)lVar30 < (int)uVar28)) {
            uVar31 = (uVar31 + uVar28) - lVar30;
          }
          puVar21 = puVar21 + 1;
        } while (puVar21 != puVar8);
      }
      local_2e8 = local_3f0 + 0x10;
      local_2e0 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&local_3d0->parse_order_;
      pvVar26 = local_3c8;
      while (((CVar27 = local_3ac, pAVar22 = local_3d0, iVar15 < (int)local_3ac ||
              ((((_Var19._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true
              )) && ((*(pointer *)pvVar26 != *(pointer *)(pvVar26 + 8) &&
                     ((CVar17 = _recognize(local_3d0,*(pointer *)(pvVar26 + 8) + -1,false),
                      CVar17 == NONE &&
                      (pbVar4 = *(pointer *)(pvVar26 + 8),
                      uVar31 < (ulong)((long)pbVar4 - *(long *)pvVar26 >> 5)))))))) {
        if (pAVar22->validate_optional_arguments_ == true) {
          local_3f0._0_8_ = local_3f0 + 0x10;
          pcVar5 = pbVar4[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3f0,pcVar5,pcVar5 + pbVar4[-1]._M_string_length);
          Option::_validate((string *)&local_2b8,
                            ((_Var19._M_current)->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                            (string *)local_3f0,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8
                    );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_unused._0_8_ != &local_2a8) {
            operator_delete(local_2b8._M_unused._M_object,local_2a8._M_allocated_capacity + 1);
          }
          uVar29 = local_3f0._8_8_;
          if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
            operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
          }
          pvVar26 = local_3c8;
          if (uVar29 != 0) break;
        }
        pOVar6 = ((_Var19._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_298._M_allocated_capacity = (size_type)&local_288;
        pcVar5 = (*(pointer *)(pvVar26 + 8))[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,pcVar5,
                   pcVar5 + (*(pointer *)(pvVar26 + 8))[-1]._M_string_length);
        iVar16 = Option::_add_result(pOVar6,(string *)&local_298,&pOVar6->results_);
        pOVar6->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity != &local_288) {
          operator_delete((void *)local_298._M_allocated_capacity,
                          local_288._M_allocated_capacity + 1);
        }
        local_3f0._0_8_ =
             ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  (local_2e0,(Option **)local_3f0);
        pbVar4 = *(pointer *)(pvVar26 + 8);
        *(pointer *)(pvVar26 + 8) = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
        }
        iVar15 = iVar15 + iVar16;
      }
      if ((*(pointer *)pvVar26 != *(pointer *)(pvVar26 + 8)) &&
         (CVar17 = _recognize(pAVar22,*(pointer *)(pvVar26 + 8) + -1,true),
         CVar17 == POSITIONAL_MARK)) {
        pbVar4 = *(pointer *)(pvVar26 + 8);
        *(pointer *)(pvVar26 + 8) = pbVar4 + -1;
        pcVar5 = pbVar4[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != &pbVar4[-1].field_2) {
          operator_delete(pcVar5,pbVar4[-1].field_2._M_allocated_capacity + 1);
        }
      }
      if ((0 < (int)CVar27) && (iVar15 == 0 && local_3bc == 0)) {
        local_150._M_string_length = 0;
        local_150.field_2._M_local_buf[0] = '\0';
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        Option::get_flag_value
                  ((string *)local_3f0,
                   ((_Var19._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,(string *)&local_388,
                   &local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        pOVar6 = ((_Var19._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_3f0._0_8_,(pointer)(local_3f0._0_8_ + local_3f0._8_8_)
                  );
        Option::_add_result(pOVar6,&local_278,&pOVar6->results_);
        pOVar6->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        local_2b8._M_unused._M_object =
             ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  (local_2e0,(Option **)&local_2b8);
        if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
      }
    }
    if (0 < local_3bc) {
      pOVar6 = ((_Var19._M_current)->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (iVar15 % pOVar6->type_size_max_ != 0) {
        if (pOVar6->type_size_max_ == pOVar6->type_size_min_) {
          pAVar25 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_b0,
                     ((_Var19._M_current)->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          pOVar6 = ((_Var19._M_current)->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          iVar15 = pOVar6->type_size_min_;
          Option::get_type_name_abi_cxx11_(&local_d0,pOVar6);
          ArgumentMismatch::PartialType(pAVar25,&local_b0,iVar15,&local_d0);
          __cxa_throw(pAVar25,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_1b8._M_string_length = 0;
        local_1b8.field_2._M_local_buf[0] = '\0';
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        Option::_add_result(pOVar6,&local_1b8,&pOVar6->results_);
        pOVar6->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,
                          CONCAT71(local_1b8.field_2._1_7_,local_1b8.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    pOVar6 = ((_Var19._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar6->trigger_on_result_ == true) {
      Option::run_callback(pOVar6);
    }
    bVar12 = true;
    if (local_348._8_8_ != 0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f0,"-",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_348);
      _parse_arg();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3c8,(value_type *)&local_348);
    }
    goto LAB_001b8178;
  }
  psVar7 = (local_3d0->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar29 = local_388._M_allocated_capacity;
  for (psVar23 = (local_3d0->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_388._M_allocated_capacity = uVar29
      , psVar23 != psVar7; psVar23 = psVar23 + 1) {
    pAVar22 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar22->name_)._M_string_length == 0) && (pAVar22->disabled_ == false)) &&
       (bVar12 = _parse_arg(pAVar22,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_3c8,current_type,param_3), bVar12)) {
      pAVar22 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar12 = true;
      if (pAVar22->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar22,(long)*(pointer *)(local_3c8 + 8) - *(long *)local_3c8 >> 5);
      }
      goto LAB_001b8178;
    }
    uVar29 = local_388._M_allocated_capacity;
  }
  if ((local_3d0->parent_ == (App *)0x0) || ((local_3d0->name_)._M_string_length != 0)) {
    __n = 0xffffffffffffffff;
    if (1 < (ulong)local_388._8_8_) {
      pvVar20 = memchr((char *)(uVar29 + 1),0x2e,local_388._8_8_ - 1);
      __n = -(ulong)(pvVar20 == (void *)0x0) | (long)pvVar20 - uVar29;
    }
    if (__n != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,0,
                 __n);
      local_3b8 = _find_subcommand(local_3d0,(string *)local_3f0,true,false);
      pvVar26 = local_3c8;
      if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
        operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
      }
      bVar12 = true;
      bVar14 = true;
      if (local_3b8 != (App *)0x0) {
        lVar30 = *(long *)(*(long *)(pvVar26 + 8) + -0x20);
        local_3f0._0_8_ = (Option *)(local_3f0 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3f0,lVar30,*(long *)(*(long *)(pvVar26 + 8) + -0x18) + lVar30);
        lVar30 = *(long *)(pvVar26 + 8);
        *(long *)(pvVar26 + 8) = lVar30 + -0x20;
        if (*(long **)(lVar30 + -0x20) != (long *)(lVar30 + -0x10)) {
          operator_delete(*(long **)(lVar30 + -0x20),*(long *)(lVar30 + -0x10) + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388,
                   __n + 1,0xffffffffffffffff);
        _parse_arg();
        if ((extraout_RAX & 1) == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                     __n + 2,0xffffffffffffffff);
          *local_3a8._M_dataplus._M_p = '-';
          if (2 < local_3a8._M_string_length) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_368,&local_3a8,3,0xffffffffffffffff);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(pvVar26,&local_368);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_368._M_dataplus._M_p != &local_368.field_2) {
              operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                      (&local_3a8,2,'\0');
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pvVar26,&local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          current_type = SHORT;
        }
        else {
          paVar3 = &local_368.field_2;
          local_368._M_dataplus._M_p = (pointer)paVar3;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"--","");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_2d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f0,
                     __n + 3,0xffffffffffffffff);
          uVar29 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar3) {
            uVar29 = local_368.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < local_368._M_string_length + local_2d8._M_string_length) {
            uVar29 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              uVar29 = local_2d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar29 < local_368._M_string_length + local_2d8._M_string_length)
            goto LAB_001b847e;
            pbVar24 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_2d8,0,0,local_368._M_dataplus._M_p,
                                 local_368._M_string_length);
          }
          else {
LAB_001b847e:
            pbVar24 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_368,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          }
          local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar24->_M_dataplus)._M_p;
          paVar1 = &pbVar24->field_2;
          if (paVar10 == paVar1) {
            local_3a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_3a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar24->field_2 + 8);
          }
          else {
            local_3a8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            local_3a8._M_dataplus._M_p = (pointer)paVar10;
          }
          local_3a8._M_string_length = pbVar24->_M_string_length;
          (pbVar24->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar24->_M_string_length = 0;
          paVar1->_M_local_buf[0] = '\0';
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(pvVar26,&local_3a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
            operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
            operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368._M_dataplus._M_p != paVar3) {
            operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
          }
          current_type = LONG;
        }
        bVar14 = _parse_arg(local_3b8,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)pvVar26,current_type,true);
        if (bVar14) {
          if (local_3b8->silent_ == false) {
            __position._M_current =
                 (local_3d0->parsed_subcommands_).
                 super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_3d0->parsed_subcommands_).
                super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              ::std::vector<CLI::App*,std::allocator<CLI::App*>>::_M_realloc_insert<CLI::App*const&>
                        ((vector<CLI::App*,std::allocator<CLI::App*>> *)
                         &local_3d0->parsed_subcommands_,__position,&local_3b8);
            }
            else {
              *__position._M_current = local_3b8;
              pppAVar2 = &(local_3d0->parsed_subcommands_).
                          super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppAVar2 = *pppAVar2 + 1;
            }
          }
          increment_parsed(local_3d0);
          _trigger_pre_parse(local_3d0,*(long *)(pvVar26 + 8) - *(long *)pvVar26 >> 5);
          if ((local_3b8->parse_complete_callback_).super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            _process_env(local_3b8);
            _process_callbacks(local_3b8);
            _process_help_flags(local_3b8,false,false);
            _process_requirements(local_3b8);
            run_callback(local_3b8,false,true);
          }
        }
        else {
          lVar30 = *(long *)(pvVar26 + 8);
          *(long *)(pvVar26 + 8) = lVar30 + -0x20;
          if (*(long **)(lVar30 + -0x20) != (long *)(lVar30 + -0x10)) {
            operator_delete(*(long **)(lVar30 + -0x20),*(long *)(lVar30 + -0x10) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pvVar26,(value_type *)local_3f0);
        }
        if ((Option *)local_3f0._0_8_ != (Option *)(local_3f0 + 0x10)) {
          operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
        }
        bVar14 = !bVar14;
      }
      if (!bVar14) goto LAB_001b8178;
    }
    pAVar22 = local_3d0;
    if (!param_3) {
      if ((local_3d0->parent_ == (App *)0x0) ||
         (pAVar11 = local_3d0->parent_, local_3d0->fallthrough_ != true)) {
        lVar30 = *(long *)(local_3c8 + 8);
        *(long *)(local_3c8 + 8) = lVar30 + -0x20;
        if (*(long **)(lVar30 + -0x20) != (long *)(lVar30 + -0x10)) {
          operator_delete(*(long **)(lVar30 + -0x20),*(long *)(lVar30 + -0x10) + 1);
        }
        local_3f0._0_4_ = current_type;
        if (pAVar22->allow_extras_ == false) {
          psVar23 = (pAVar22->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = (pAVar22->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar23 != psVar7) {
            bVar12 = false;
            do {
              peVar9 = (psVar23->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (((peVar9->name_)._M_string_length == 0) && (peVar9->allow_extras_ == true)) {
                ::std::
                vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                          ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                            *)&peVar9->missing_,(Classifier *)local_3f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_308);
                if (!bVar12) goto LAB_001b82ec;
                break;
              }
              psVar23 = psVar23 + 1;
              bVar12 = psVar23 == psVar7;
            } while (!bVar12);
          }
        }
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&pAVar22->missing_,(Classifier *)local_3f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308);
LAB_001b82ec:
        bVar12 = true;
      }
      else {
        do {
          pAVar22 = pAVar11;
          if (pAVar22->parent_ == (App *)0x0) break;
          pAVar11 = pAVar22->parent_;
        } while ((pAVar22->name_)._M_string_length == 0);
        bVar12 = _parse_arg(pAVar22,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_3c8,current_type,false);
      }
      goto LAB_001b8178;
    }
  }
  bVar12 = false;
LAB_001b8178:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_allocated_capacity != &local_338) {
    operator_delete((void *)local_348._M_allocated_capacity,
                    CONCAT71(local_338._M_allocated_capacity._1_7_,local_338._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_allocated_capacity != &local_318) {
    operator_delete((void *)local_328._M_allocated_capacity,
                    CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_allocated_capacity != &local_378) {
    operator_delete((void *)local_388._M_allocated_capacity,
                    CONCAT71(local_378._M_allocated_capacity._1_7_,local_378._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_allocated_capacity != &local_2f8) {
    operator_delete((void *)local_308._M_allocated_capacity,local_2f8._M_allocated_capacity + 1);
  }
  return bVar12;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    if(op_ptr == std::end(options_)) {
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}